

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_send(tnt_stream_net *s,char *buf,size_t size)

{
  ssize_t sVar1;
  ssize_t r;
  size_t size_local;
  char *buf_local;
  tnt_stream_net *s_local;
  
  if ((s->sbuf).buf == (char *)0x0) {
    s_local = (tnt_stream_net *)tnt_io_send_raw(s,buf,size,1);
  }
  else if ((s->sbuf).size < size) {
    s->error = TNT_EBIG;
    s_local = (tnt_stream_net *)0xffffffffffffffff;
  }
  else {
    s_local = (tnt_stream_net *)size;
    if ((s->sbuf).size < (s->sbuf).off + size) {
      sVar1 = tnt_io_send_raw(s,(s->sbuf).buf,(s->sbuf).off,1);
      if (sVar1 == -1) {
        s_local = (tnt_stream_net *)0xffffffffffffffff;
      }
      else {
        (s->sbuf).off = size;
        memcpy((s->sbuf).buf,buf,size);
      }
    }
    else {
      memcpy((s->sbuf).buf + (s->sbuf).off,buf,size);
      (s->sbuf).off = size + (s->sbuf).off;
    }
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_io_send(struct tnt_stream_net *s, const char *buf, size_t size)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_send_raw(s, buf, size, 1);
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		memcpy(s->sbuf.buf + s->sbuf.off, buf, size);
		s->sbuf.off += size;
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = size;
	memcpy(s->sbuf.buf, buf, size);
	return size;
}